

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateNucleus(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *threshold)

{
  int *in_RDI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000090;
  int in_stack_00000098;
  int in_stack_0000009c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000a8;
  int in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000c0;
  Pring *pivot;
  int c;
  int r;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000410;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000418;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar1;
  undefined1 local_100 [56];
  undefined1 local_c8 [8];
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff40;
  undefined1 local_90 [56];
  int *local_58;
  int local_50;
  int local_4c;
  undefined1 *local_28;
  undefined1 *local_18;
  reference local_10;
  undefined1 *local_8;
  
  if (*in_RDI != 2) {
    in_RDI[0xc6] = -1;
    in_RDI[0xc4] = -1;
    in_RDI[0xc5] = -1;
    do {
      if (in_RDI[1] + -1 <= in_RDI[0xbe]) {
        if (in_RDI[1] <= in_RDI[0xbe]) {
          return;
        }
        local_4c = *(int *)(*(long *)(*(long *)(in_RDI + 0xce) + 0x20) + 0x10);
        local_50 = *(int *)(*(long *)(*(long *)(in_RDI + 0xca) + 0x20) + 0x10);
        *(undefined4 *)(*(long *)(in_RDI + 0x8e) + (long)local_4c * 4) = 0;
        *(int *)(*(long *)(in_RDI + 0xa6) + (long)local_50 * 4) =
             *(int *)(*(long *)(in_RDI + 0xa6) + (long)local_50 * 4) + -1;
        iVar1 = in_RDI[0xbe];
        local_10 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0x84),
                                (long)*(int *)(*(long *)(in_RDI + 0x8c) + (long)local_4c * 4));
        local_8 = local_100;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar1,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
        setPivot(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b4,
                 in_stack_000000a8);
        return;
      }
      if (*(long *)(*(long *)(in_RDI + 0xce) + 0x20) == *(long *)(in_RDI + 0xce) + 0x20) {
        if (*(long *)(*(long *)(in_RDI + 0xca) + 0x20) == *(long *)(in_RDI + 0xca) + 0x20) {
          *(int **)(in_RDI + 0xc0) = in_RDI + 0xc0;
          *(int **)(in_RDI + 0xc2) = in_RDI + 0xc0;
          local_28 = local_90;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
          selectPivots(in_stack_00000418,in_stack_00000410);
          for (local_58 = *(int **)(in_RDI + 0xc0); local_58 != in_RDI + 0xc0;
              local_58 = *(int **)local_58) {
            local_18 = local_c8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8);
            eliminatePivot(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000090);
          }
        }
        else {
          eliminateColSingletons(in_stack_ffffffffffffff40);
        }
      }
      else {
        eliminateRowSingletons(in_stack_00000008);
      }
    } while ((**(long **)(in_RDI + 0xce) == *(long *)(in_RDI + 0xce)) &&
            (**(long **)(in_RDI + 0xca) == *(long *)(in_RDI + 0xca)));
    *in_RDI = 2;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminateNucleus(const R eps,
                                    const R threshold)
{
   int r, c;
   CLUFactor<R>::Pring* pivot;

   if(this->stat == SLinSolver<R>::SINGULAR)
      return;

   temp.pivots.mkwtz = -1;

   temp.pivots.idx = -1;

   temp.pivots.pos = -1;

   while(temp.stage < thedim - 1)
   {
#ifndef NDEBUG
      int i;
      // CLUFactorIsConsistent(fac);

      for(i = 0; i < thedim; ++i)
         if(col.perm[i] < 0)
            assert(temp.s_mark[i] == 0);

#endif

      if(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]))
         /* row singleton available */
         eliminateRowSingletons();
      else if(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]))
         /* column singleton available */
         eliminateColSingletons();
      else
      {
         initDR(temp.pivots);
         selectPivots(threshold);

         assert(temp.pivots.next != &temp.pivots &&
                "ERROR: no pivot element selected");

         for(pivot = temp.pivots.next; pivot != &temp.pivots;
               pivot = pivot->next)
         {
            eliminatePivot(pivot->idx, pivot->pos, eps);
         }
      }

      if(temp.pivot_rowNZ->next != temp.pivot_rowNZ ||
            temp.pivot_colNZ->next != temp.pivot_colNZ)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   if(temp.stage < thedim)
   {
      /*      Eliminate remaining element.
       *      Note, that this must be both, column and row singleton.
       */
      assert(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]) &&
             "ERROR: one row must be left");
      assert(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]) &&
             "ERROR: one col must be left");
      r = temp.pivot_rowNZ[1].next->idx;
      c = temp.pivot_colNZ[1].next->idx;
      u.row.len[r] = 0;
      u.col.len[c]--;
      setPivot(temp.stage, c, r, u.row.val[u.row.start[r]]);
   }
}